

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32_c_api_tests.c
# Opt level: O0

void decode_and_encode_c1_longExample_producesSameResult(void)

{
  bech32_error bVar1;
  int iVar2;
  bech32_DecodedResult *decodedResult_00;
  bech32_bstring *bstring_00;
  bech32_bstring *bstring;
  bech32_DecodedResult *decodedResult;
  size_t expectedDpSize;
  char local_38;
  char expectedHrp [7];
  char bstr [46];
  
  memcpy(&local_38,"abcdef1qpzry9x8gf2tvdw0s3jn54khce6mua7lmqqqxw",0x2e);
  expectedDpSize._1_4_ = 0x64636261;
  expectedDpSize._5_2_ = 0x6665;
  expectedDpSize._7_1_ = 0;
  decodedResult_00 = bech32_create_DecodedResult(&local_38);
  bVar1 = bech32_decode(decodedResult_00,&local_38);
  if (bVar1 != E_BECH32_SUCCESS) {
    __assert_fail("bech32_decode(decodedResult, bstr) == E_BECH32_SUCCESS",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x1d4,"void decode_and_encode_c1_longExample_producesSameResult(void)");
  }
  iVar2 = strcmp(decodedResult_00->hrp,(char *)((long)&expectedDpSize + 1));
  if (iVar2 != 0) {
    __assert_fail("strcmp(decodedResult->hrp, expectedHrp) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x1d5,"void decode_and_encode_c1_longExample_producesSameResult(void)");
  }
  if (decodedResult_00->dplen != 0x20) {
    __assert_fail("decodedResult->dplen == expectedDpSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x1d6,"void decode_and_encode_c1_longExample_producesSameResult(void)");
  }
  if (decodedResult_00->encoding == ENCODING_BECH32) {
    bstring_00 = bech32_create_bstring(decodedResult_00->hrplen,decodedResult_00->dplen);
    bVar1 = bech32_encode_using_original_constant
                      (bstring_00,decodedResult_00->hrp,decodedResult_00->dp,decodedResult_00->dplen
                      );
    if (bVar1 != E_BECH32_SUCCESS) {
      __assert_fail("bech32_encode_using_original_constant(bstring, decodedResult->hrp, decodedResult->dp, decodedResult->dplen) == E_BECH32_SUCCESS"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                    ,0x1db,"void decode_and_encode_c1_longExample_producesSameResult(void)");
    }
    iVar2 = strcmp(&local_38,bstring_00->string);
    if (iVar2 == 0) {
      bech32_free_DecodedResult(decodedResult_00);
      bech32_free_bstring(bstring_00);
      return;
    }
    __assert_fail("strcmp(bstr, bstring->string) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                  ,0x1dc,"void decode_and_encode_c1_longExample_producesSameResult(void)");
  }
  __assert_fail("ENCODING_BECH32 == decodedResult->encoding",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dcdpr[P]libbech32/test/testbech32/bech32_c_api_tests.c"
                ,0x1d7,"void decode_and_encode_c1_longExample_producesSameResult(void)");
}

Assistant:

void decode_and_encode_c1_longExample_producesSameResult(void) {
    char bstr[] = "abcdef1qpzry9x8gf2tvdw0s3jn54khce6mua7lmqqqxw";
    char expectedHrp[] = "abcdef";
    const size_t expectedDpSize = 32; // 32 = num chars after '1', minus 6 for checksum chars

    bech32_DecodedResult * decodedResult = bech32_create_DecodedResult(bstr);

    assert(bech32_decode(decodedResult, bstr) == E_BECH32_SUCCESS);
    assert(strcmp(decodedResult->hrp, expectedHrp) == 0);
    assert(decodedResult->dplen == expectedDpSize);
    assert(ENCODING_BECH32 == decodedResult->encoding);

    bech32_bstring *bstring = bech32_create_bstring(decodedResult->hrplen, decodedResult->dplen);

    assert(bech32_encode_using_original_constant(bstring, decodedResult->hrp, decodedResult->dp, decodedResult->dplen) == E_BECH32_SUCCESS);
    assert(strcmp(bstr, bstring->string) == 0);

    bech32_free_DecodedResult(decodedResult);
    bech32_free_bstring(bstring);
}